

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<cs::type_t> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::type_t>,64ul,cs_impl::default_allocator_provider>::
alloc<cs_impl::iostream_cs_ext::init()::__0,cs::type_id,std::shared_ptr<cs::name_space>&>
          (allocator_type<cs_impl::any::holder<cs::type_t>,_64UL,_cs_impl::default_allocator_provider>
           *this,anon_class_1_0_00000001 *args,type_id *args_1,shared_ptr<cs::name_space> *args_2)

{
  long lVar1;
  __int_type _Var2;
  holder<cs::type_t> *__p;
  new_allocator<cs_impl::any::holder<cs::type_t>_> *in_RCX;
  anon_class_1_0_00000001 *in_RDI;
  holder<cs::type_t> *ptr;
  type_id *in_stack_ffffffffffffffc8;
  size_type __n;
  
  __n = 0;
  if (*(long *)(in_RDI + 0x208) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)0x0);
    if (_Var2 == 0) {
      lVar1 = *(long *)(in_RDI + 0x208);
      *(long *)(in_RDI + 0x208) = lVar1 + -1;
      __p = *(holder<cs::type_t> **)(in_RDI + lVar1 * 8 + -8);
      goto LAB_0024b57c;
    }
  }
  __p = __gnu_cxx::new_allocator<cs_impl::any::holder<cs::type_t>_>::allocate(in_RCX,__n,in_RDI);
LAB_0024b57c:
  __gnu_cxx::new_allocator<cs_impl::any::holder<cs::type_t>>::
  construct<cs_impl::any::holder<cs::type_t>,cs_impl::iostream_cs_ext::init()::__0,cs::type_id,std::shared_ptr<cs::name_space>&>
            (in_RCX,__p,in_RDI,in_stack_ffffffffffffffc8,(shared_ptr<cs::name_space> *)0x24b5a1);
  return __p;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}